

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall ON_Viewport::Read(ON_Viewport *this,ON_BinaryArchive *file)

{
  ON_3dPoint candidate_point;
  ON_3dVector candidate_vector;
  ON_3dVector candidate_vector_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  view_projection vVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  double dVar9;
  double in_stack_ffffffffffffff60;
  double local_90;
  double scaleZ;
  double scaleY;
  double scaleX;
  double dStack_70;
  bool b;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  ON__INT32 local_28;
  bool local_21;
  int i;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_Viewport *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  operator=(this,&DefaultTopViewYUp);
  this->m_bValidCamera = false;
  this->m_bValidFrustum = false;
  this->m_bValidPort = false;
  this->m_bValidCameraFrame = false;
  *(undefined8 *)(this->m_projection_content_sha1).m_digest =
       ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
  *(undefined8 *)((this->m_projection_content_sha1).m_digest + 8) =
       ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  *(undefined4 *)((this->m_projection_content_sha1).m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  iStack_1c = 0;
  i = 1;
  local_21 = ON_BinaryArchive::Read3dmChunkVersion(_minor_version,&stack0xffffffffffffffe4,&i);
  if ((!local_21) || (iStack_1c != 1)) goto LAB_0097fa1c;
  local_28 = 0;
  if (local_21) {
    local_21 = ON_BinaryArchive::ReadInt(_minor_version,&local_28);
  }
  if (local_21 != false) {
    this->m_bValidCamera = (bool)(-(local_28 != 0) & 1);
    this->m_bValidCameraFrame = (bool)(this->m_bValidCamera & 1);
    local_21 = ON_BinaryArchive::ReadInt(_minor_version,&local_28);
  }
  if (local_21 != false) {
    this->m_bValidFrustum = (bool)(-(local_28 != 0) & 1);
    local_21 = ON_BinaryArchive::ReadInt(_minor_version,&local_28);
  }
  if (local_21 != false) {
    this->m_bValidPort = (bool)(-(local_28 != 0) & 1);
    local_21 = ON_BinaryArchive::ReadInt(_minor_version,&local_28);
  }
  if (local_21 != false) {
    vVar8 = ON::ViewProjection(local_28);
    this->m_projection = vVar8;
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadPoint(_minor_version,&this->m_CamLoc);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadVector(_minor_version,&this->m_CamDir);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadVector(_minor_version,&this->m_CamUp);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadVector(_minor_version,&this->m_CamX);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadVector(_minor_version,&this->m_CamY);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadVector(_minor_version,&this->m_CamZ);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_frus_left);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_frus_right);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_frus_bottom);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_frus_top);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_frus_near);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_frus_far);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_port_left);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_port_right);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_port_bottom);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_port_top);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_port_near);
  }
  if ((local_21 & 1U) != 0) {
    local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_port_far);
  }
  if ((this->m_bValidCamera & 1U) != 0) {
    dVar9 = (this->m_CamLoc).x;
    local_38 = (this->m_CamLoc).y;
    local_30 = (this->m_CamLoc).z;
    uVar1 = (this->m_CamLoc).y;
    uVar2 = (this->m_CamLoc).z;
    candidate_point.y = (double)uVar2;
    candidate_point.x = (double)uVar1;
    candidate_point.z = in_stack_ffffffffffffff60;
    local_40 = dVar9;
    bVar7 = IsValidCameraLocation(candidate_point);
    if (!bVar7) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_viewport.cpp"
                 ,0x13c,"","ON_Viewport.m_bValidCamera in file was true and it should be false.",
                 in_R8,in_R9,dVar9);
      this->m_bValidCamera = false;
    }
    dVar9 = (this->m_CamUp).x;
    local_50 = (this->m_CamUp).y;
    local_48 = (this->m_CamUp).z;
    uVar3 = (this->m_CamUp).y;
    uVar4 = (this->m_CamUp).z;
    candidate_vector.y = (double)uVar4;
    candidate_vector.x = (double)uVar3;
    candidate_vector.z = in_stack_ffffffffffffff60;
    local_58 = dVar9;
    bVar7 = IsValidCameraUpOrDirection(candidate_vector);
    if (bVar7) {
      dVar9 = (this->m_CamDir).x;
      local_68 = (this->m_CamDir).y;
      local_60 = (this->m_CamDir).z;
      uVar5 = (this->m_CamDir).y;
      uVar6 = (this->m_CamDir).z;
      candidate_vector_00.y = (double)uVar6;
      candidate_vector_00.x = (double)uVar5;
      candidate_vector_00.z = in_stack_ffffffffffffff60;
      dStack_70 = dVar9;
      bVar7 = IsValidCameraUpOrDirection(candidate_vector_00);
      if (!bVar7) goto LAB_0097f53f;
    }
    else {
LAB_0097f53f:
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_viewport.cpp"
                 ,0x141,"","ON_Viewport.m_bValidCamera in file was true and it should be false.",
                 in_R8,in_R9,dVar9);
      this->m_bValidCamera = false;
      this->m_bValidCameraFrame = false;
    }
    if ((this->m_bValidCamera & 1U) == 0) {
      if (this->m_projection == perspective_view) {
        SetCamera(this,&DefaultPerspectiveViewZUp,true);
      }
      else {
        SetCamera(this,&DefaultTopViewYUp,true);
      }
    }
  }
  if (((local_21 & 1U) != 0) && (0 < i)) {
    if ((local_21 & 1U) != 0) {
      local_21 = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_viewport_id);
    }
    if (((local_21 & 1U) != 0) && (1 < i)) {
      scaleX._7_1_ = 0;
      if ((local_21 & 1U) != 0) {
        local_21 = ON_BinaryArchive::ReadBool(_minor_version,(bool *)((long)&scaleX + 7));
      }
      if ((local_21 & 1U) != 0) {
        SetCameraUpLock(this,(bool)(scaleX._7_1_ & 1));
      }
      scaleX._7_1_ = 0;
      if ((local_21 & 1U) != 0) {
        local_21 = ON_BinaryArchive::ReadBool(_minor_version,(bool *)((long)&scaleX + 7));
      }
      if ((local_21 & 1U) != 0) {
        SetCameraDirectionLock(this,(bool)(scaleX._7_1_ & 1));
      }
      scaleX._7_1_ = 0;
      if ((local_21 & 1U) != 0) {
        local_21 = ON_BinaryArchive::ReadBool(_minor_version,(bool *)((long)&scaleX + 7));
      }
      if ((local_21 & 1U) != 0) {
        SetCameraLocationLock(this,(bool)(scaleX._7_1_ & 1));
      }
      scaleX._7_1_ = 0;
      if ((local_21 & 1U) != 0) {
        local_21 = ON_BinaryArchive::ReadBool(_minor_version,(bool *)((long)&scaleX + 7));
      }
      if ((local_21 & 1U) != 0) {
        SetFrustumLeftRightSymmetry(this,(bool)(scaleX._7_1_ & 1));
      }
      scaleX._7_1_ = 0;
      if ((local_21 & 1U) != 0) {
        local_21 = ON_BinaryArchive::ReadBool(_minor_version,(bool *)((long)&scaleX + 7));
      }
      if ((local_21 & 1U) != 0) {
        SetFrustumTopBottomSymmetry(this,(bool)(scaleX._7_1_ & 1));
      }
      if (((((local_21 & 1U) != 0) && (2 < i)) &&
          (local_21 = ON_BinaryArchive::ReadPoint(_minor_version,&this->m_target_point), local_21))
         && (((3 < i && (local_21 = ON_BinaryArchive::ReadBool
                                              (_minor_version,&this->m_bValidCameraFrame), local_21)
              ) && (4 < i)))) {
        scaleY = 1.0;
        scaleZ = 1.0;
        local_90 = 1.0;
        local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&scaleY);
        if (local_21) {
          local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&scaleZ);
        }
        if (local_21 != false) {
          local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&local_90);
        }
        if (local_21 != false) {
          SetViewScale(this,scaleY,scaleZ,local_90);
        }
      }
    }
  }
  if (((this->m_bValidFrustum & 1U) != 0) &&
     ((((bVar7 = ON_IsValid(this->m_frus_left), !bVar7 ||
        (bVar7 = ON_IsValid(this->m_frus_right), !bVar7)) ||
       ((((bVar7 = ON_IsValid(this->m_frus_top), !bVar7 ||
          (((bVar7 = ON_IsValid(this->m_frus_bottom), !bVar7 ||
            (bVar7 = ON_IsValid(this->m_frus_near), !bVar7)) ||
           (bVar7 = ON_IsValid(this->m_frus_far), !bVar7)))) ||
         ((this->m_frus_right <= this->m_frus_left || (this->m_frus_top <= this->m_frus_bottom))))
        || (this->m_frus_near <= 0.0)))) ||
      (((this->m_frus_far <= this->m_frus_near || (this->m_frus_left <= -1e+100)) ||
       ((1e+100 < this->m_frus_right || this->m_frus_right == 1e+100 ||
        (((this->m_frus_bottom <= -1e+100 ||
          (1e+100 < this->m_frus_top || this->m_frus_top == 1e+100)) ||
         (1e+100 < this->m_frus_far || this->m_frus_far == 1e+100)))))))))) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_viewport.cpp"
               ,0x194,"","ON_Viewport.m_bValidFrustum in file was true and it should be false.");
    this->m_bValidFrustum = false;
  }
LAB_0097fa1c:
  return (bool)(local_21 & 1);
}

Assistant:

bool ON_Viewport::Read( ON_BinaryArchive& file )
{
  *this = ON_Viewport::DefaultTopViewYUp;

  m_bValidCamera = false;
  m_bValidFrustum = false;
  m_bValidPort = false;
  m_bValidCameraFrame = false;

  m_projection_content_sha1 = ON_SHA1_Hash::ZeroDigest;

  int major_version = 0;
  int minor_version = 1;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) 
  {
    // common to all 1.x versions
    int i=0;
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_bValidCamera = (i?true:false);
    if (rc)
      m_bValidCameraFrame = m_bValidCamera;
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_bValidFrustum = (i?true:false);
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_bValidPort = (i?true:false);
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_projection = ON::ViewProjection(i);
    if (rc) rc = file.ReadPoint( m_CamLoc );
    if (rc) rc = file.ReadVector( m_CamDir );
    if (rc) rc = file.ReadVector( m_CamUp );
    if (rc) rc = file.ReadVector( m_CamX );
    if (rc) rc = file.ReadVector( m_CamY );
    if (rc) rc = file.ReadVector( m_CamZ );
    if (rc) rc = file.ReadDouble( &m_frus_left );
    if (rc) rc = file.ReadDouble( &m_frus_right );
    if (rc) rc = file.ReadDouble( &m_frus_bottom );
    if (rc) rc = file.ReadDouble( &m_frus_top );
    if (rc) rc = file.ReadDouble( &m_frus_near );
    if (rc) rc = file.ReadDouble( &m_frus_far );
    if (rc) rc = file.ReadInt( &m_port_left );
    if (rc) rc = file.ReadInt( &m_port_right );
    if (rc) rc = file.ReadInt( &m_port_bottom );
    if (rc) rc = file.ReadInt( &m_port_top );
    if (rc) rc = file.ReadInt( &m_port_near );
    if (rc) rc = file.ReadInt( &m_port_far );   

    if ( m_bValidCamera )
    {
      if ( !ON_Viewport::IsValidCameraLocation(m_CamLoc) )
      {
        ON_ERROR("ON_Viewport.m_bValidCamera in file was true and it should be false.");
        m_bValidCamera = false;
      }
      if ( !ON_Viewport::IsValidCameraUpOrDirection(m_CamUp) || !ON_Viewport::IsValidCameraUpOrDirection(m_CamDir) )
      {
        ON_ERROR("ON_Viewport.m_bValidCamera in file was true and it should be false.");
        m_bValidCamera = false;
        m_bValidCameraFrame = false;
      }
      if (!m_bValidCamera)
      {
        if (ON::view_projection::perspective_view == m_projection)
          SetCamera(ON_Viewport::DefaultPerspectiveViewZUp, true);
        else
          SetCamera(ON_Viewport::DefaultTopViewYUp, true);
      }
    }

    if (rc && minor_version >= 1 )
    {
      // 1.1 fields
      if (rc) rc = file.ReadUuid(m_viewport_id);

      if (rc && minor_version >= 2 )
      {
        // 1.2 fields 
        bool b;
        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetCameraUpLock(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetCameraDirectionLock(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetCameraLocationLock(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetFrustumLeftRightSymmetry(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetFrustumTopBottomSymmetry(b);

        if (rc && minor_version >= 3 )
        {
          // added 18, June 2013 to V6
          rc = file.ReadPoint(m_target_point);

          if (rc && minor_version >= 4)
          {
            rc = file.ReadBool(&m_bValidCameraFrame);

            if (rc && minor_version >= 5)
            {
              double scaleX = 1, scaleY = 1, scaleZ = 1;
              rc = file.ReadDouble(&scaleX);
              if (rc) rc = file.ReadDouble(&scaleY);
              if (rc) rc = file.ReadDouble(&scaleZ);
              if (rc)
              {
                SetViewScale(scaleX, scaleY, scaleZ);
              }
            }
          }
        }
      }
    }

    if( m_bValidFrustum )
    {
      if (    !ON_IsValid(m_frus_left) || !ON_IsValid(m_frus_right)
           || !ON_IsValid(m_frus_top)  || !ON_IsValid(m_frus_bottom)
           || !ON_IsValid(m_frus_near) || !ON_IsValid(m_frus_far)
           || !(m_frus_left < m_frus_right)
           || !(m_frus_bottom < m_frus_top)
           || !(0.0 < m_frus_near)
           || !(m_frus_near < m_frus_far)
           || !(-ON_NONSENSE_WORLD_COORDINATE_VALUE < m_frus_left)
           || !(m_frus_right < ON_NONSENSE_WORLD_COORDINATE_VALUE)
           || !(-ON_NONSENSE_WORLD_COORDINATE_VALUE < m_frus_bottom)
           || !(m_frus_top < ON_NONSENSE_WORLD_COORDINATE_VALUE)
           || !(m_frus_far < ON_NONSENSE_WORLD_COORDINATE_VALUE)
         )
      {
        ON_ERROR("ON_Viewport.m_bValidFrustum in file was true and it should be false.");
        m_bValidFrustum = false;
      }
    }
  }
  return rc;
}